

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_java_struct_tuple_writer
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *ptVar1;
  bool bVar2;
  int iVar3;
  e_req eVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  reference pptVar6;
  allocator local_109;
  string local_108;
  string local_e8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_c8;
  t_field **local_c0;
  int local_b4;
  undefined1 local_b0 [4];
  int j;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_90;
  t_field **local_88;
  int local_80;
  int i;
  allocator local_69;
  string local_68;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_48;
  t_field **local_40;
  int local_38;
  byte local_31;
  int optional_count;
  bool has_optional;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  t_struct *tstruct_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"@Override");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"public void write(org.apache.thrift.protocol.TProtocol prot, ");
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar5 = std::operator<<(poVar5,(string *)CONCAT44(extraout_var,iVar3));
  poVar5 = std::operator<<(poVar5," struct) throws org.apache.thrift.TException {");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,
                           "org.apache.thrift.protocol.TTupleProtocol oprot = (org.apache.thrift.protocol.TTupleProtocol) prot;"
                          );
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  f_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     *)&optional_count);
  local_31 = 0;
  local_38 = 0;
  local_40 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  _optional_count = (const_iterator)local_40;
  while( true ) {
    local_48._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)&optional_count,&local_48);
    if (!bVar2) break;
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)&optional_count);
    eVar4 = t_field::get_req(*pptVar6);
    if (eVar4 == T_OPTIONAL) {
LAB_00342e55:
      local_38 = local_38 + 1;
      local_31 = 1;
    }
    else {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)&optional_count);
      eVar4 = t_field::get_req(*pptVar6);
      if (eVar4 == T_OPT_IN_REQ_OUT) goto LAB_00342e55;
    }
    pptVar6 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)&optional_count);
    eVar4 = t_field::get_req(*pptVar6);
    if (eVar4 == T_REQUIRED) {
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)&optional_count);
      ptVar1 = *pptVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,"struct.",&local_69);
      generate_serialize_field(this,out,ptVar1,&local_68,false);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                *)&optional_count);
  }
  if ((local_31 & 1) != 0) {
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"java.util.BitSet optionals = new java.util.BitSet();");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    local_80 = 0;
    local_88 = (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    _optional_count = (const_iterator)local_88;
    while( true ) {
      local_90._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&optional_count,&local_90);
      if (!bVar2) break;
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)&optional_count);
      eVar4 = t_field::get_req(*pptVar6);
      if (eVar4 == T_OPTIONAL) {
LAB_00342fe8:
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"if (struct.");
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                               *)&optional_count);
        generate_isset_check_abi_cxx11_((string *)local_b0,this,*pptVar6);
        poVar5 = std::operator<<(poVar5,(string *)local_b0);
        poVar5 = std::operator<<(poVar5,") {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)local_b0);
        t_generator::indent_up((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"optionals.set(");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_80);
        poVar5 = std::operator<<(poVar5,");");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        t_generator::indent_down((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"}");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        local_80 = local_80 + 1;
      }
      else {
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                               *)&optional_count);
        eVar4 = t_field::get_req(*pptVar6);
        if (eVar4 == T_OPT_IN_REQ_OUT) goto LAB_00342fe8;
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)&optional_count);
    }
    poVar5 = t_generator::indent((t_generator *)this,out);
    poVar5 = std::operator<<(poVar5,"oprot.writeBitSet(optionals, ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_38);
    poVar5 = std::operator<<(poVar5,");");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    local_b4 = 0;
    local_c0 = (t_field **)
               std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
    _optional_count = (const_iterator)local_c0;
    while( true ) {
      local_c8._M_current =
           (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&optional_count,&local_c8);
      if (!bVar2) break;
      pptVar6 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                             *)&optional_count);
      eVar4 = t_field::get_req(*pptVar6);
      if (eVar4 == T_OPTIONAL) {
LAB_00343219:
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"if (struct.");
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                               *)&optional_count);
        generate_isset_check_abi_cxx11_(&local_e8,this,*pptVar6);
        poVar5 = std::operator<<(poVar5,(string *)&local_e8);
        poVar5 = std::operator<<(poVar5,") {");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_e8);
        t_generator::indent_up((t_generator *)this);
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                               *)&optional_count);
        ptVar1 = *pptVar6;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_108,"struct.",&local_109);
        generate_serialize_field(this,out,ptVar1,&local_108,false);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
        t_generator::indent_down((t_generator *)this);
        poVar5 = t_generator::indent((t_generator *)this,out);
        poVar5 = std::operator<<(poVar5,"}");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        local_b4 = local_b4 + 1;
      }
      else {
        pptVar6 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                               *)&optional_count);
        eVar4 = t_field::get_req(*pptVar6);
        if (eVar4 == T_OPT_IN_REQ_OUT) goto LAB_00343219;
      }
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  *)&optional_count);
    }
  }
  t_generator::indent_down((t_generator *)this);
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::operator<<(poVar5,"}");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_tuple_writer(ostream& out, t_struct* tstruct) {
  indent(out) << "@Override" << endl;
  indent(out) << "public void write(org.apache.thrift.protocol.TProtocol prot, "
              << tstruct->get_name() << " struct) throws org.apache.thrift.TException {" << endl;
  indent_up();
  indent(out) << "org.apache.thrift.protocol.TTupleProtocol oprot = (org.apache.thrift.protocol.TTupleProtocol) prot;" << endl;

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;
  bool has_optional = false;
  int optional_count = 0;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_OPTIONAL
        || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
      optional_count++;
      has_optional = true;
    }
    if ((*f_iter)->get_req() == t_field::T_REQUIRED) {
      generate_serialize_field(out, (*f_iter), "struct.", false);
    }
  }
  if (has_optional) {
    indent(out) << "java.util.BitSet optionals = new java.util.BitSet();" << endl;
    int i = 0;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if ((*f_iter)->get_req() == t_field::T_OPTIONAL
          || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
        indent(out) << "if (struct." << generate_isset_check((*f_iter)) << ") {" << endl;
        indent_up();
        indent(out) << "optionals.set(" << i << ");" << endl;
        indent_down();
        indent(out) << "}" << endl;
        i++;
      }
    }

    indent(out) << "oprot.writeBitSet(optionals, " << optional_count << ");" << endl;
    int j = 0;
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      if ((*f_iter)->get_req() == t_field::T_OPTIONAL
          || (*f_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
        indent(out) << "if (struct." << generate_isset_check(*f_iter) << ") {" << endl;
        indent_up();
        generate_serialize_field(out, (*f_iter), "struct.", false);
        indent_down();
        indent(out) << "}" << endl;
        j++;
      }
    }
  }
  indent_down();
  indent(out) << "}" << endl;
}